

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbc.cpp
# Opt level: O1

void __thiscall Libdbc::DbcParser::parse_file(DbcParser *this,istream *stream)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pMVar2;
  pointer pMVar3;
  pointer pMVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar2 = (this->messages).super__Vector_base<Libdbc::Message,_std::allocator<Libdbc::Message>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (this->messages).super__Vector_base<Libdbc::Message,_std::allocator<Libdbc::Message>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pMVar4 = pMVar2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if (pMVar3 != pMVar2) {
    do {
      (**pMVar4->_vptr_Message)(pMVar4);
      pMVar4 = pMVar4 + 1;
    } while (pMVar4 != pMVar3);
    (this->messages).super__Vector_base<Libdbc::Message,_std::allocator<Libdbc::Message>_>._M_impl.
    super__Vector_impl_data._M_finish = pMVar2;
  }
  parse_dbc_header(this,stream);
  parse_dbc_nodes(this,stream);
  while (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0) {
    Utils::StreamHandler::get_next_non_blank_line(stream,&local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_68,&local_50);
  }
  parse_dbc_messages(this,&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DbcParser::parse_file(std::istream& stream) {
	std::string line;
	std::vector<std::string> lines;

	messages.clear();

	parse_dbc_header(stream);
	parse_dbc_nodes(stream);

	while (!stream.eof()) {
		Utils::StreamHandler::get_next_non_blank_line(stream, line);
		lines.push_back(line);
	}

	parse_dbc_messages(lines);
}